

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O2

filepos_t EBML_ElementFullSize(ebml_element *Element,bool_t bWithDefault)

{
  uint8_t SizeLength;
  uint uVar1;
  byte bVar2;
  long lVar3;
  bool_t bSizeIsFinite;
  long lStack_30;
  
  if (bWithDefault == 0) {
    if (Element == (ebml_element *)0x0) {
      __assert_fail("(const void*)(Element)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                    ,0x7a,"filepos_t EBML_ElementFullSize(const ebml_element *, bool_t)");
    }
    lVar3 = (**(code **)((long)(Element->Base).Base.VMT + 0x88))(Element);
    if (lVar3 != 0) {
      return -1;
    }
  }
  lVar3 = Element->DataSize;
  uVar1 = Element->Context->Id;
  if (uVar1 < 0x100) {
    lStack_30 = 1;
  }
  else if (uVar1 < 0x10000) {
    lStack_30 = 2;
  }
  else {
    lStack_30 = 4 - (ulong)(uVar1 < 0x1000000);
  }
  SizeLength = Element->SizeLength;
  bSizeIsFinite = EBML_ElementIsFiniteSize(Element);
  bVar2 = EBML_CodedSizeLength(lVar3,SizeLength,bSizeIsFinite);
  return (ulong)bVar2 + lStack_30 + lVar3;
}

Assistant:

filepos_t EBML_ElementFullSize(const ebml_element *Element, bool_t bWithDefault)
{
    if (!bWithDefault && EBML_ElementIsDefaultValue(Element))
        return INVALID_FILEPOS_T; // won't be saved
    return Element->DataSize + GetIdLength(Element->Context->Id) + EBML_CodedSizeLength(Element->DataSize, Element->SizeLength, EBML_ElementIsFiniteSize(Element));
}